

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O3

bool duckdb_re2::re2_internal::Parse<unsigned_short>
               (char *str,size_t n,unsigned_short *dest,int radix)

{
  bool bVar1;
  unsigned_long r;
  ulong local_10;
  
  bVar1 = Parse<unsigned_long>(str,n,&local_10,radix);
  if ((bVar1) && (local_10 < 0x10000)) {
    bVar1 = true;
    if (dest != (unsigned_short *)0x0) {
      *dest = (unsigned_short)local_10;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Parse(const char* str, size_t n, unsigned short* dest, int radix) {
  unsigned long r;
  if (!Parse(str, n, &r, radix)) return false;  // Could not parse
  if ((unsigned short)r != r) return false;     // Out of range
  if (dest == NULL) return true;
  *dest = (unsigned short)r;
  return true;
}